

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::TransRangeSyntax::TransRangeSyntax
          (TransRangeSyntax *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,
          TransRepeatRangeSyntax *repeat)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_RDI;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffffa8;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,TransRange);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (in_RDI,in_stack_ffffffffffffffa8);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RDX;
  (in_RDI->elements)._M_ptr = (pointer)in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x2b7dff);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::ExpressionSyntax_*> *)in_stack_ffffffffffffffa8
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pEVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                          *)0x2b7e3e);
    (pEVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)in_RDI);
  }
  if (in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode != (SyntaxNode *)0x0) {
    (in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode)->parent = (SyntaxNode *)in_RDI;
  }
  return;
}

Assistant:

TransRangeSyntax(const SeparatedSyntaxList<ExpressionSyntax>& items, TransRepeatRangeSyntax* repeat) :
        SyntaxNode(SyntaxKind::TransRange), items(items), repeat(repeat) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->repeat) this->repeat->parent = this;
    }